

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::BaseAtomTypesSectionParser::BaseAtomTypesSectionParser(BaseAtomTypesSectionParser *this)

{
  SectionParser *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  SectionParser::SectionParser((SectionParser *)0x2136b8);
  in_RDI->_vptr_SectionParser = (_func_int **)&PTR__BaseAtomTypesSectionParser_004fd560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  SectionParser::setSectionName(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return;
}

Assistant:

BaseAtomTypesSectionParser::BaseAtomTypesSectionParser() {
    setSectionName("BaseAtomTypes");
  }